

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O0

anytype_t * anytype_from_str(anytype_t *val,int t,char *str)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  double dVar4;
  char *str_local;
  int t_local;
  anytype_t *val_local;
  
  if (val == (anytype_t *)0x0) {
    val_local = (anytype_t *)0x0;
  }
  else {
    val_local = val;
    if (str == (char *)0x0) {
      if ((val->ptr != (void *)0x0) && ((t & 8U) != 0)) {
        ckd_free(val->ptr);
      }
      memset(val,0,8);
    }
    else {
      sVar2 = strlen(str);
      if (sVar2 == 0) {
        val_local = (anytype_t *)0x0;
      }
      else {
        switch(t) {
        case 2:
        case 3:
          iVar1 = __isoc99_sscanf(str,"%ld",val);
          if (iVar1 != 1) {
            val_local = (anytype_t *)0x0;
          }
          break;
        case 4:
        case 5:
          dVar4 = atof_c(str);
          val->fl = dVar4;
          break;
        default:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                  ,0x2be,"Unknown argument type: %d\n",(ulong)(uint)t);
          val_local = (anytype_t *)0x0;
          break;
        case 8:
        case 9:
          if (val->ptr != (void *)0x0) {
            ckd_free(val->ptr);
          }
          pcVar3 = __ckd_salloc__(str,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                                  ,699);
          val->ptr = pcVar3;
          break;
        case 0x10:
        case 0x11:
          if ((((*str == 'y') || (*str == 't')) || (*str == 'Y')) ||
             ((*str == 'T' || (*str == '1')))) {
            val->i = 1;
          }
          else if (((*str == 'n') || (*str == 'f')) ||
                  ((*str == 'N' || (*str == 'F' || *str == '0')))) {
            val->ptr = (void *)0x0;
          }
          else {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                    ,0x2b3,"Unparsed boolean value \'%s\'\n",str);
            val_local = (anytype_t *)0x0;
          }
        }
      }
    }
  }
  return val_local;
}

Assistant:

anytype_t *
anytype_from_str(anytype_t *val, int t, const char *str)
{
    if (val == NULL)
        return NULL;
    if (str == NULL) {
        if (val->ptr && (t & ARG_STRING))
            ckd_free(val->ptr);
        memset(val, 0, sizeof(*val));
        return val;
    }
    if (strlen(str) == 0)
        return NULL;
    switch (t) {
    case ARG_INTEGER:
    case REQARG_INTEGER:
        if (sscanf(str, "%ld", &val->i) != 1)
            return NULL;
        break;
    case ARG_FLOATING:
    case REQARG_FLOATING:
        val->fl = atof_c(str);
        break;
    case ARG_BOOLEAN:
    case REQARG_BOOLEAN:
        if ((str[0] == 'y') || (str[0] == 't') ||
            (str[0] == 'Y') || (str[0] == 'T') || (str[0] == '1')) {
            val->i = TRUE;
        }
        else if ((str[0] == 'n') || (str[0] == 'f') ||
                 (str[0] == 'N') || (str[0] == 'F') |
                 (str[0] == '0')) {
            val->i = FALSE;
        }
        else {
            E_ERROR("Unparsed boolean value '%s'\n", str);
            return NULL;
        }
        break;
    case ARG_STRING:
    case REQARG_STRING:
        if (val->ptr)
            ckd_free(val->ptr);
        val->ptr = ckd_salloc(str);
        break;
    default:
        E_ERROR("Unknown argument type: %d\n", t);
        return NULL;
    }
    return val;
}